

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_select_node.cpp
# Opt level: O2

void __thiscall
duckdb::Transformer::TransformModifiers(Transformer *this,PGSelectStmt *stmt,QueryNode *node)

{
  PGNode *pPVar1;
  undefined8 uVar2;
  pointer pOVar3;
  pointer pLVar4;
  pointer pLVar5;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var6;
  vector<duckdb::OrderByNode,_true> orders;
  undefined1 local_48 [24];
  __buckets_ptr pp_Stack_30;
  size_type local_28;
  
  local_48._16_8_ = (__buckets_ptr)0x0;
  pp_Stack_30 = (__buckets_ptr)0x0;
  local_28 = 0;
  TransformOrderBy(this,stmt->sortClause,(vector<duckdb::OrderByNode,_true> *)(local_48 + 0x10));
  if ((__buckets_ptr)local_48._16_8_ != pp_Stack_30) {
    make_uniq<duckdb::OrderModifier>();
    pOVar3 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
             operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                         *)(local_48 + 8));
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::_M_move_assign
              (&(pOVar3->orders).
                super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>,
               local_48 + 0x10);
    local_48._0_8_ = local_48._8_8_;
    local_48._8_8_ = (ParserOptions *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
                *)&node->modifiers,
               (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                *)local_48);
    if ((ResultModifier *)local_48._0_8_ != (ResultModifier *)0x0) {
      (*((BaseExpression *)local_48._0_8_)->_vptr_BaseExpression[1])();
    }
    if ((ResultModifier *)local_48._8_8_ != (ResultModifier *)0x0) {
      (*((BaseExpression *)local_48._8_8_)->_vptr_BaseExpression[1])();
    }
  }
  pPVar1 = stmt->limitCount;
  if (stmt->limitOffset == (PGNode *)0x0 && pPVar1 == (PGNode *)0x0) goto LAB_013667f1;
  if ((pPVar1 == (PGNode *)0x0) || (pPVar1->type != T_PGLimitPercent)) {
    make_uniq<duckdb::LimitModifier>();
    if (stmt->offset_first == true) {
      if (stmt->limitOffset != (PGNode *)0x0) {
        TransformExpression((Transformer *)local_48,
                            (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
        pLVar5 = unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                 ::operator->((unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                               *)(local_48 + 8));
        uVar2 = local_48._0_8_;
        local_48._0_8_ = (_Head_base<0UL,_duckdb::ResultModifier_*,_false>)0x0;
        _Var6._M_head_impl =
             (pLVar5->offset).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (pLVar5->offset).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)uVar2;
        if (_Var6._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)&(_Var6._M_head_impl)->super_BaseExpression + 8))();
          if ((ResultModifier *)local_48._0_8_ != (ResultModifier *)0x0) {
            (**(code **)((long)((BaseExpression *)local_48._0_8_)->_vptr_BaseExpression + 8))();
          }
        }
      }
      if (stmt->limitCount != (PGNode *)0x0) {
        TransformExpression((Transformer *)local_48,
                            (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
        pLVar5 = unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                 ::operator->((unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                               *)(local_48 + 8));
        _Var6._M_head_impl =
             (pLVar5->limit).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (pLVar5->limit).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)local_48._0_8_;
LAB_0136679b:
        local_48._0_8_ = (_Head_base<0UL,_duckdb::ResultModifier_*,_false>)0x0;
        if (_Var6._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)((long)((_Var6._M_head_impl)->super_BaseExpression)._vptr_BaseExpression + 8))
                    ();
          if ((_Tuple_impl<0UL,_duckdb::ResultModifier_*,_std::default_delete<duckdb::ResultModifier>_>
               )local_48._0_8_ != (ResultModifier *)0x0) {
            (**(code **)(*(long *)local_48._0_8_ + 8))();
          }
        }
      }
    }
    else {
      if (stmt->limitCount != (PGNode *)0x0) {
        TransformExpression((Transformer *)local_48,
                            (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
        pLVar5 = unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                 ::operator->((unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                               *)(local_48 + 8));
        uVar2 = local_48._0_8_;
        local_48._0_8_ = (ResultModifier *)0x0;
        _Var6._M_head_impl =
             (pLVar5->limit).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (pLVar5->limit).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)uVar2;
        if (_Var6._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)&(_Var6._M_head_impl)->super_BaseExpression + 8))();
          if ((ResultModifier *)local_48._0_8_ != (ResultModifier *)0x0) {
            (**(code **)(*(long *)local_48._0_8_ + 8))();
          }
        }
      }
      if (stmt->limitOffset != (PGNode *)0x0) {
        TransformExpression((Transformer *)local_48,
                            (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
        pLVar5 = unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                 ::operator->((unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                               *)(local_48 + 8));
        _Var6._M_head_impl =
             (pLVar5->offset).
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (pLVar5->offset).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)local_48._0_8_;
        goto LAB_0136679b;
      }
    }
    local_48._0_8_ = local_48._8_8_;
    local_48._8_8_ = (ParserOptions *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
                *)&node->modifiers,
               (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                *)local_48);
  }
  else {
    make_uniq<duckdb::LimitPercentModifier>();
    local_48._0_8_ = stmt->limitCount;
    optional_ptr<duckdb_libpgquery::PGLimitPercent,_true>::operator->
              ((optional_ptr<duckdb_libpgquery::PGLimitPercent,_true> *)local_48);
    TransformExpression((Transformer *)local_48,(optional_ptr<duckdb_libpgquery::PGNode,_true>)this)
    ;
    pLVar4 = unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
             ::operator->((unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
                           *)(local_48 + 8));
    uVar2 = local_48._0_8_;
    local_48._0_8_ = (_Head_base<0UL,_duckdb::ResultModifier_*,_false>)0x0;
    _Var6._M_head_impl =
         (pLVar4->limit).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pLVar4->limit).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)uVar2;
    if (_Var6._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var6._M_head_impl)->super_BaseExpression + 8))();
      if ((ResultModifier *)local_48._0_8_ != (ResultModifier *)0x0) {
        (**(code **)((long)((BaseExpression *)local_48._0_8_)->_vptr_BaseExpression + 8))();
      }
    }
    if (stmt->limitOffset != (PGNode *)0x0) {
      TransformExpression((Transformer *)local_48,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
      pLVar4 = unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
               ::operator->((unique_ptr<duckdb::LimitPercentModifier,_std::default_delete<duckdb::LimitPercentModifier>,_true>
                             *)(local_48 + 8));
      uVar2 = local_48._0_8_;
      local_48._0_8_ = (_Head_base<0UL,_duckdb::ResultModifier_*,_false>)0x0;
      _Var6._M_head_impl =
           (pLVar4->offset).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pLVar4->offset).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)uVar2;
      if (_Var6._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var6._M_head_impl)->super_BaseExpression + 8))();
        if ((_Tuple_impl<0UL,_duckdb::ResultModifier_*,_std::default_delete<duckdb::ResultModifier>_>
             )local_48._0_8_ != (ResultModifier *)0x0) {
          (**(code **)(*(long *)local_48._0_8_ + 8))();
        }
      }
    }
    local_48._0_8_ = local_48._8_8_;
    local_48._8_8_ = (ParserOptions *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
                *)&node->modifiers,
               (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                *)local_48);
  }
  if ((_Head_base<0UL,_duckdb::ResultModifier_*,_false>)local_48._0_8_ !=
      (_Head_base<0UL,_duckdb::ResultModifier_*,_false>)0x0) {
    (*((BaseExpression *)local_48._0_8_)->_vptr_BaseExpression[1])();
  }
  if ((ParserOptions *)local_48._8_8_ != (ParserOptions *)0x0) {
    (**(code **)(*(long *)local_48._8_8_ + 8))();
  }
LAB_013667f1:
  ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
            ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)(local_48 + 0x10))
  ;
  return;
}

Assistant:

void Transformer::TransformModifiers(duckdb_libpgquery::PGSelectStmt &stmt, QueryNode &node) {
	// transform the common properties
	// both the set operations and the regular select can have an ORDER BY/LIMIT attached to them
	vector<OrderByNode> orders;
	TransformOrderBy(stmt.sortClause, orders);
	if (!orders.empty()) {
		auto order_modifier = make_uniq<OrderModifier>();
		order_modifier->orders = std::move(orders);
		node.modifiers.push_back(std::move(order_modifier));
	}

	if (stmt.limitCount || stmt.limitOffset) {
		if (stmt.limitCount && stmt.limitCount->type == duckdb_libpgquery::T_PGLimitPercent) {
			auto limit_percent_modifier = make_uniq<LimitPercentModifier>();
			auto expr_node = PGPointerCast<duckdb_libpgquery::PGLimitPercent>(stmt.limitCount)->limit_percent;
			limit_percent_modifier->limit = TransformExpression(expr_node);
			if (stmt.limitOffset) {
				limit_percent_modifier->offset = TransformExpression(stmt.limitOffset);
			}
			node.modifiers.push_back(std::move(limit_percent_modifier));
		} else {
			auto limit_modifier = make_uniq<LimitModifier>();
			if (stmt.offset_first) {
				if (stmt.limitOffset) {
					limit_modifier->offset = TransformExpression(stmt.limitOffset);
				}
				if (stmt.limitCount) {
					limit_modifier->limit = TransformExpression(stmt.limitCount);
				}
			} else {
				if (stmt.limitCount) {
					limit_modifier->limit = TransformExpression(stmt.limitCount);
				}
				if (stmt.limitOffset) {
					limit_modifier->offset = TransformExpression(stmt.limitOffset);
				}
			}
			node.modifiers.push_back(std::move(limit_modifier));
		}
	}
}